

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialSort.cpp
# Opt level: O3

void __thiscall
Assimp::SpatialSort::Append
          (SpatialSort *this,aiVector3D *pPositions,uint pNumPositions,uint pElementOffset,
          bool pFinalize)

{
  pointer *ppEVar1;
  undefined8 uVar2;
  iterator __position;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  char *tempPointer;
  Entry local_4c;
  vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_> *local_38;
  
  local_38 = &this->mPositions;
  uVar4 = ((long)(this->mPositions).
                 super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->mPositions).
                 super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
  std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>::reserve
            (local_38,(pNumPositions << !pFinalize) + uVar4);
  if (pNumPositions != 0) {
    uVar5 = (ulong)pNumPositions;
    uVar6 = 0;
    do {
      local_4c.mDistance =
           *(float *)((long)&pPositions->z + uVar6) * (this->mPlaneNormal).z +
           *(float *)((long)&pPositions->x + uVar6) * (this->mPlaneNormal).x +
           *(float *)((long)&pPositions->y + uVar6) * (this->mPlaneNormal).y;
      uVar3 = (uint)uVar4;
      local_4c.mPosition.z = *(float *)((long)&pPositions->z + uVar6);
      uVar2 = *(undefined8 *)((long)&pPositions->x + uVar6);
      local_4c.mPosition.x = (float)uVar2;
      local_4c.mPosition.y = (float)((ulong)uVar2 >> 0x20);
      __position._M_current =
           (this->mPositions).
           super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_4c.mIndex = uVar3;
      if (__position._M_current ==
          (this->mPositions).
          super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>::
        _M_realloc_insert<Assimp::SpatialSort::Entry>(local_38,__position,&local_4c);
      }
      else {
        (__position._M_current)->mDistance = local_4c.mDistance;
        (__position._M_current)->mIndex = uVar3;
        ((__position._M_current)->mPosition).x = local_4c.mPosition.x;
        ((__position._M_current)->mPosition).y = local_4c.mPosition.y;
        ((__position._M_current)->mPosition).z = local_4c.mPosition.z;
        ppEVar1 = &(this->mPositions).
                   super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppEVar1 = *ppEVar1 + 1;
      }
      uVar4 = (ulong)(uVar3 + 1);
      uVar6 = (ulong)((int)uVar6 + pElementOffset);
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  if (pFinalize) {
    Finalize(this);
  }
  return;
}

Assistant:

void SpatialSort::Append( const aiVector3D* pPositions, unsigned int pNumPositions,
    unsigned int pElementOffset,
    bool pFinalize /*= true */)
{
    // store references to all given positions along with their distance to the reference plane
    const size_t initial = mPositions.size();
    mPositions.reserve(initial + (pFinalize?pNumPositions:pNumPositions*2));
    for( unsigned int a = 0; a < pNumPositions; a++)
    {
        const char* tempPointer = reinterpret_cast<const char*> (pPositions);
        const aiVector3D* vec   = reinterpret_cast<const aiVector3D*> (tempPointer + a * pElementOffset);

        // store position by index and distance
        ai_real distance = *vec * mPlaneNormal;
        mPositions.push_back( Entry( static_cast<unsigned int>(a+initial), *vec, distance));
    }

    if (pFinalize) {
        // now sort the array ascending by distance.
        Finalize();
    }
}